

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

uint64 crnlib::pack_etc1s_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 )

{
  crn_etc_quality cVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  undefined1 *puVar8;
  int refine_medium [4];
  results results;
  int scan [9];
  int refine_high [8];
  uint8 selectors [16];
  etc1_optimizer optimizer;
  int local_1e8 [4];
  ulong local_1d8;
  uint local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined1 *local_1c0;
  int local_1b0;
  undefined2 local_1ac;
  undefined4 local_1a8;
  color_quad_u8 *local_1a0;
  undefined1 local_198;
  undefined4 *local_190;
  undefined8 local_188;
  undefined1 local_180;
  int local_178 [12];
  int local_148 [8];
  undefined1 local_128 [16];
  etc1_optimizer local_118;
  
  piVar4 = local_1e8;
  local_118.m_sorted_luma[1].m_p = (uint *)0x0;
  local_118.m_sorted_luma[1].m_size = 0;
  local_118.m_sorted_luma[1].m_capacity = 0;
  local_118.m_sorted_luma[0].m_p = (uint *)0x0;
  local_118.m_sorted_luma[0].m_size = 0;
  local_118.m_sorted_luma[0].m_capacity = 0;
  local_118.m_luma.m_p = (unsigned_short *)0x0;
  local_118.m_luma.m_size = 0;
  local_118.m_luma.m_capacity = 0;
  local_118.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_118.m_best_solution.m_selectors.m_size = 0;
  local_118.m_best_solution.m_selectors.m_capacity = 0;
  local_118.m_selectors.m_p = (uchar *)0x0;
  local_118.m_selectors.m_size = 0;
  local_118.m_selectors.m_capacity = 0;
  local_118.m_best_selectors.m_p = (uchar *)0x0;
  local_118.m_best_selectors.m_size._0_1_ = 0;
  local_118.m_best_selectors._9_7_ = 0;
  local_118.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_118.m_best_solution.m_coords._1_8_ = 0;
  local_118.m_best_solution.m_error = 0xffffffffffffffff;
  local_118.m_best_solution.m_valid = false;
  local_118.m_trial_solution.m_coords.m_color4 = false;
  local_118.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_118.m_trial_solution.m_coords.m_inten_table = 0;
  local_118.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_118.m_trial_solution.m_selectors.m_size = 0;
  local_118.m_trial_solution.m_selectors.m_capacity = 0;
  local_118.m_trial_solution.m_error = 0xffffffffffffffff;
  local_118.m_trial_solution.m_valid = false;
  local_118.m_temp_selectors.m_p = (uchar *)0x0;
  local_118.m_temp_selectors.m_size = 0;
  local_118.m_temp_selectors.m_capacity = 0;
  local_118.m_pParams = (params *)0x0;
  local_118.m_pResult = (results *)0x0;
  local_118.m_pSorted_luma_indices = (uint32 *)0x0;
  local_118.m_pSorted_luma = (uint32 *)0x0;
  local_1b0 = 2;
  local_1ac = 1;
  local_198 = 0;
  local_190 = &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_188 = 1;
  local_180 = 0;
  local_1a8 = 0x10;
  puVar8 = local_128;
  local_1c8 = 0x10;
  local_1c0 = puVar8;
  local_1a0 = pSrc_pixels;
  etc1_optimizer::init(&local_118,(EVP_PKEY_CTX *)&local_1b0);
  local_178[4] = 0;
  local_178[5] = 1;
  local_178[6] = 2;
  local_178[7] = 3;
  local_178[0] = -4;
  local_178[1] = -3;
  local_178[2] = -2;
  local_178[3] = -1;
  local_178[8] = 4;
  cVar1 = pack_params->m_quality;
  iVar2 = (cVar1 == cCRNETCQualityMedium) + 1 + (uint)(cVar1 == cCRNETCQualityMedium);
  if (cVar1 == cCRNETCQualitySlow) {
    iVar2 = 9;
  }
  local_190 = (undefined4 *)((long)local_178 + (ulong)(9 - iVar2) * 2);
  local_188._0_4_ = iVar2;
  etc1_optimizer::compute(&local_118);
  if (local_1b0 != 0 && 6000 < local_1d8) {
    local_1e8[0] = -3;
    local_1e8[1] = -2;
    local_1e8[2] = 2;
    local_1e8[3] = 3;
    local_148[4] = 5;
    local_148[5] = 6;
    local_148[6] = 7;
    local_148[7] = 8;
    local_148[0] = -8;
    local_148[1] = -7;
    local_148[2] = -6;
    local_148[3] = -5;
    if (local_1b0 == 1) {
      local_188._0_4_ = 4;
    }
    else {
      local_188._0_4_ = 2;
      if (12000 < local_1d8) {
        local_188._0_4_ = 8;
      }
      piVar4 = (int *)((long)local_148 + (ulong)(8 - (int)local_188) * 2);
    }
    local_190 = piVar4;
    etc1_optimizer::compute(&local_118);
  }
  bVar5 = 8;
  iVar2 = 0;
  uVar3 = 0;
  do {
    lVar6 = 0;
    bVar7 = bVar5;
    do {
      uVar3 = uVar3 | ((*(byte *)((long)&g_selector_index_to_etc1 + (ulong)(byte)puVar8[lVar6]) & 1)
                       << 0x10 |
                      (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)(byte)puVar8[lVar6])
                            >> 1)) << (bVar7 & 0xf);
      bVar7 = bVar7 + 4;
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 4);
    iVar2 = iVar2 + 1;
    bVar5 = bVar5 + 1;
    puVar8 = puVar8 + 4;
  } while (iVar2 != 4);
  (dst_block->field_0).m_uint64 =
       (ulong)(local_1cc << 0x1a | 0x2000000U | (local_1d0 & 0xbfffff) << 3) |
       CONCAT44(uVar3,local_1cc << 0x1d);
  etc1_optimizer::~etc1_optimizer(&local_118);
  return local_1d8;
}

Assistant:

uint64 pack_etc1s_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params) {
  uint8 selectors[16];
  etc1_optimizer optimizer;
  etc1_optimizer::params params;
  params.m_pSrc_pixels = pSrc_pixels;
  params.m_num_src_pixels = 16;
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  etc1_optimizer::results results;
  results.m_pSelectors = selectors;
  results.m_n = 16;
  optimizer.init(params, results);

  const int scan[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
  params.m_scan_delta_size = pack_params.m_quality == cCRNETCQualitySlow ? CRNLIB_ARRAY_SIZE(scan) : pack_params.m_quality == cCRNETCQualityMedium ? 3 : 1;
  params.m_pScan_deltas = scan + ((CRNLIB_ARRAY_SIZE(scan) - params.m_scan_delta_size) >> 1);
  optimizer.compute();

  if (params.m_quality >= cCRNETCQualityMedium && results.m_error > 6000) {
    const int refine_medium[] = {-3, -2, 2, 3};
    const int refine_high[] = {-8, -7, -6, -5, 5, 6, 7, 8};
    if (params.m_quality == cCRNETCQualityMedium) {
      params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(refine_medium);
      params.m_pScan_deltas = refine_medium;
    } else {
      params.m_scan_delta_size = results.m_error > 12000 ? CRNLIB_ARRAY_SIZE(refine_high) : 2;
      params.m_pScan_deltas = refine_high + ((CRNLIB_ARRAY_SIZE(refine_high) - params.m_scan_delta_size) >> 1);
    }
    optimizer.compute();
  }

  uint32 selector = 0;
  for (uint32 i = 0, t = 8, h = 0; h < 4; h++, t -= 15) {
    for (uint32 w = 0; w < 4; w++, t += 4, i++) {
      uint32 s = g_selector_index_to_etc1[selectors[i]];
      selector |= (s >> 1 | (s & 1) << 16) << (t & 15);
    }
  }

  dst_block.m_uint64 = (uint64)selector << 32 | results.m_block_inten_table << 29 | results.m_block_inten_table << 26 | 1 << 25 | (results.m_block_color_unscaled.m_u32 & 0xFFFFFF) << 3;
  return results.m_error;
}